

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islamcal.cpp
# Opt level: O3

void icu_63::IslamicCalendar::initializeSystemDefaultCentury(void)

{
  UDate millis;
  UErrorCode status;
  IslamicCalendar calendar;
  UErrorCode local_35c;
  Locale local_358;
  Calendar local_278;
  
  local_35c = U_ZERO_ERROR;
  Locale::Locale(&local_358,"@calendar=islamic-civil",(char *)0x0,(char *)0x0,(char *)0x0);
  IslamicCalendar((IslamicCalendar *)&local_278,&local_358,&local_35c,CIVIL);
  Locale::~Locale(&local_358);
  if (local_35c < U_ILLEGAL_ARGUMENT_ERROR) {
    millis = Calendar::getNow();
    Calendar::setTimeInMillis(&local_278,millis,&local_35c);
    Calendar::add(&local_278,UCAL_YEAR,-0x50,&local_35c);
    gSystemDefaultCenturyStart = Calendar::getTimeInMillis(&local_278,&local_35c);
    gSystemDefaultCenturyStartYear = Calendar::get(&local_278,UCAL_YEAR,&local_35c);
  }
  Calendar::~Calendar(&local_278);
  return;
}

Assistant:

U_CFUNC void U_CALLCONV
IslamicCalendar::initializeSystemDefaultCentury()
{
    // initialize systemDefaultCentury and systemDefaultCenturyYear based
    // on the current time.  They'll be set to 80 years before
    // the current time.
    UErrorCode status = U_ZERO_ERROR;
    IslamicCalendar calendar(Locale("@calendar=islamic-civil"),status);
    if (U_SUCCESS(status)) {
        calendar.setTime(Calendar::getNow(), status);
        calendar.add(UCAL_YEAR, -80, status);

        gSystemDefaultCenturyStart = calendar.getTime(status);
        gSystemDefaultCenturyStartYear = calendar.get(UCAL_YEAR, status);
    }
    // We have no recourse upon failure unless we want to propagate the failure
    // out.
}